

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall
QProcess::start(QProcess *this,QString *program,QStringList *arguments,OpenMode mode)

{
  long lVar1;
  bool bVar2;
  QProcessPrivate *s;
  long in_FS_OFFSET;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> in_stack_0000002c;
  QProcessPrivate *d;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar3;
  QProcessPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = d_func((QProcess *)0x791c7c);
  if (s->processState == '\0') {
    bVar2 = QString::isEmpty((QString *)0x791cc7);
    if (bVar2) {
      uVar3 = 0;
      tr((char *)s,(char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
         in_stack_ffffffffffffff5c);
      QProcessPrivate::setErrorAndEmit
                ((QProcessPrivate *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                 (ProcessError)((ulong)s >> 0x20),
                 (QString *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      QString::~QString((QString *)0x791d19);
    }
    else {
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QList<QString>::operator=
                ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (QList<QString> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QProcessPrivate::start(in_stack_ffffffffffffffd0,(OpenMode)in_stack_0000002c.i);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd0,
               "QProcess::start: Process is already running");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::start(const QString &program, const QStringList &arguments, OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return;
    }
    if (program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return;
    }

    d->program = program;
    d->arguments = arguments;

    d->start(mode);
}